

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch.c
# Opt level: O2

void find_best_pitch(opus_val32 *xcorr,opus_val16 *y,int len,int max_pitch,int *best_pitch)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  best_pitch[0] = 0;
  best_pitch[1] = 1;
  uVar2 = 0;
  uVar4 = 0;
  if (0 < len) {
    uVar4 = (ulong)(uint)len;
  }
  fVar5 = 1.0;
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    fVar5 = fVar5 + y[uVar2] * y[uVar2];
  }
  iVar1 = 0;
  uVar2 = (ulong)(uint)max_pitch;
  if (max_pitch < 1) {
    uVar2 = 0;
  }
  fVar8 = -1.0;
  fVar11 = -1.0;
  fVar9 = 0.0;
  fVar6 = 0.0;
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    fVar7 = fVar6;
    if ((0.0 < (float)xcorr[uVar4]) &&
       (fVar10 = (float)xcorr[uVar4] * 1e-12, fVar10 = fVar10 * fVar10,
       fVar5 * fVar8 < fVar9 * fVar10)) {
      iVar3 = (int)uVar4;
      if (fVar6 * fVar10 <= fVar5 * fVar11) {
        best_pitch[1] = iVar3;
        fVar8 = fVar10;
        fVar9 = fVar5;
      }
      else {
        best_pitch[1] = iVar1;
        *best_pitch = iVar3;
        fVar7 = fVar5;
        fVar8 = fVar11;
        fVar9 = fVar6;
        fVar11 = fVar10;
        iVar1 = iVar3;
      }
    }
    fVar6 = fVar5 + (y[(long)len + uVar4] * y[(long)len + uVar4] - y[uVar4] * y[uVar4]);
    fVar5 = 1.0;
    if (1.0 <= fVar6) {
      fVar5 = fVar6;
    }
    fVar6 = fVar7;
  }
  return;
}

Assistant:

static void find_best_pitch(opus_val32 *xcorr, opus_val16 *y, int len,
                            int max_pitch, int *best_pitch
#ifdef FIXED_POINT
        , int yshift, opus_val32 maxcorr
#endif
) {
    int i, j;
    opus_val32 Syy = 1;
    opus_val16 best_num[2];
    opus_val32 best_den[2];
#ifdef FIXED_POINT
    int xshift;

    xshift = celt_ilog2(maxcorr)-14;
#endif

    best_num[0] = -1;
    best_num[1] = -1;
    best_den[0] = 0;
    best_den[1] = 0;
    best_pitch[0] = 0;
    best_pitch[1] = 1;
    for (j = 0; j < len; j++)
        Syy = ADD32(Syy, SHR32(MULT16_16(y[j], y[j]), yshift));
    for (i = 0; i < max_pitch; i++) {
        if (xcorr[i] > 0) {
            opus_val16 num;
            opus_val32 xcorr16;
            xcorr16 = EXTRACT16(VSHR32(xcorr[i], xshift));
#ifndef FIXED_POINT
            /* Considering the range of xcorr16, this should avoid both underflows
               and overflows (inf) when squaring xcorr16 */
            xcorr16 *= 1e-12f;
#endif
            num = MULT16_16_Q15(xcorr16, xcorr16);
            if (MULT16_32_Q15(num, best_den[1]) > MULT16_32_Q15(best_num[1], Syy)) {
                if (MULT16_32_Q15(num, best_den[0]) > MULT16_32_Q15(best_num[0], Syy)) {
                    best_num[1] = best_num[0];
                    best_den[1] = best_den[0];
                    best_pitch[1] = best_pitch[0];
                    best_num[0] = num;
                    best_den[0] = Syy;
                    best_pitch[0] = i;
                } else {
                    best_num[1] = num;
                    best_den[1] = Syy;
                    best_pitch[1] = i;
                }
            }
        }
        Syy += SHR32(MULT16_16(y[i + len], y[i + len]), yshift) - SHR32(MULT16_16(y[i], y[i]), yshift);
        Syy = MAX32(1, Syy);
    }
}